

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_str_to_revision.cpp
# Opt level: O1

void __thiscall
StrToRevision_PositiveOverflow_Test::TestBody(StrToRevision_PositiveOverflow_Test *this)

{
  char *message;
  AssertionResult gtest_ar;
  ostringstream str;
  maybe<unsigned_int,_void> local_1c0;
  maybe<unsigned_int,_void> local_1b8;
  internal local_1b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a8;
  string local_1a0;
  ostringstream local_180 [112];
  ios_base local_110 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  std::ostream::_M_insert<unsigned_long_long>((ulonglong)local_180);
  std::__cxx11::stringbuf::str();
  pstore::str_to_revision(&local_1c0,&local_1a0);
  local_1b8.valid_ = false;
  local_1b8._1_3_ = 0;
  local_1b8.storage_ = (type)0x0;
  testing::internal::CmpHelperEQ<pstore::maybe<unsigned_int,void>,pstore::maybe<unsigned_int,void>>
            (local_1b0,"pstore::str_to_revision (str.str ())","pstore::nothing<unsigned> ()",
             &local_1c0,&local_1b8);
  if (local_1b8.valid_ == true) {
    local_1b8 = (maybe<unsigned_int,_void>)((ulong)local_1b8 & 0xffffffffffffff00);
  }
  if (local_1c0.valid_ == true) {
    local_1c0.valid_ = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if (local_1b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1a0);
    if (local_1a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_1a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_str_to_revision.cpp"
               ,0x53,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c0,(Message *)&local_1a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1c0);
    if ((long *)local_1a0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1a0._M_dataplus._M_p + 8))();
    }
  }
  if (local_1a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1a8,local_1a8);
  }
  std::__cxx11::ostringstream::~ostringstream(local_180);
  std::ios_base::~ios_base(local_110);
  return;
}

Assistant:

TEST (StrToRevision, PositiveOverflow) {
    std::ostringstream str;
    str << std::numeric_limits<unsigned>::max () + 1ULL;
    EXPECT_EQ (pstore::str_to_revision (str.str ()), pstore::nothing<unsigned> ());
}